

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O3

void __thiscall
HawkTracer::client::CallgrindConverter::_print_function
          (CallgrindConverter *this,ofstream *file,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *root)

{
  element_type *peVar1;
  pointer pcVar2;
  pointer ppVar3;
  _Elt_pointer ppVar4;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  pointer __args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  fnc_queue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  _Deque_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_initialize_map(&local_88,0);
  peVar1 = (root->
           super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (peVar1->data).label._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (peVar1->data).label._M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  std::
  deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,std::__cxx11::string>
            ((deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
              *)&local_88,root,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      ppVar4 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"fn=",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(ppVar4->second)._M_dataplus._M_p,
                          (ppVar4->second)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"1 ",2);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)file);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      peVar1 = (ppVar4->first).
               super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      ppVar3 = *(pointer *)
                ((long)&(peVar1->children).
                        super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (__args = (peVar1->children).
                    super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != ppVar3; __args = __args + 1
          ) {
        peVar1 = (__args->first).
                 super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_a8[0] = local_98;
        pcVar2 = (peVar1->data).label._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,pcVar2,pcVar2 + (peVar1->data).label._M_string_length);
        std::__cxx11::string::append((char *)local_a8);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_a8,(ulong)(ppVar4->second)._M_dataplus._M_p);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c8.field_2._M_allocated_capacity = *psVar7;
          local_c8.field_2._8_8_ = plVar6[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar7;
          local_c8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_c8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"cfn=",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)file,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"calls=",6);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)file,__args->second);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," 1\n",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"1 ",2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)file);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::
        deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
        ::
        emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::__cxx11::string&>
                  ((deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
                    *)&local_88,&__args->first,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      std::
      deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop_front((deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_88);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque((deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void CallgrindConverter::_print_function(std::ofstream& file, std::shared_ptr<CallGraph::TreeNode> root)
{
    std::queue<std::pair<std::shared_ptr<CallGraph::TreeNode>, std::string>> fnc_queue;
    fnc_queue.emplace(root, root->data.label + "()");

    while (!fnc_queue.empty())
    {
        auto& fnc = fnc_queue.front();
        file << "fn=" << fnc.second << "\n";
        file << "1 " << fnc.first->total_duration - fnc.first->total_children_duration << "\n";
        for (const auto& child : fnc.first->children)
        {
            std::string child_label = child.first->data.label + "()'" + fnc.second;
            file << "cfn=" << child_label << "\n";
            file << "calls=" << child.second << " 1\n";
            file << "1 " << child.first->total_duration << "\n";
            fnc_queue.emplace(child.first, child_label);
        }
        fnc_queue.pop();
    }
}